

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitffi-sysv64.cpp
# Opt level: O2

ArgumentInfo *
JitFFI::SysV64::GetArgInfo
          (ArgumentInfo *__return_storage_ptr__,ArgTypeUnit *restype,ArgTypeList *atlist)

{
  ArgTypeUnit *atu;
  ArgumentInfo *pAVar1;
  OP t1;
  ArgType AVar2;
  uint uVar3;
  ArgTypeInfo *this;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  _List_node_base *p_Var7;
  StructTypeData local_43;
  OP local_42;
  StructBaseData local_41;
  RetData ard;
  StructTypeData local_39;
  ArgumentInfo *local_38;
  
  this = (ArgTypeInfo *)operator_new(0x18);
  uVar6 = (atlist->
          super__List_base<const_JitFFI::ArgTypeUnit_*,_std::allocator<const_JitFFI::ArgTypeUnit_*>_>
          )._M_impl._M_node._M_size;
  if (0xfffffffe < uVar6) {
    __assert_fail("atlist.size() < UINT32_MAX",
                  "/workspace/llm4binary/github/license_c_cmakelists/CVM-Projects[P]JitFFI/source/jitffi-def.h"
                  ,0xa2,
                  "ArgTypeInfo JitFFI::create_argtypeinfo(const ArgTypeUnit &, const ArgTypeList &) [ArgTypeInfo = JitFFI::SysV64::ArgTypeInfo, ArgPassData = JitFFI::SysV64::ArgTypeInfo::PassData, ArgRetData = JitFFI::SysV64::ArgTypeInfo::RetData, pass_f = &JitFFI::SysV64::get_argtypeinfo_pass_data, ret_f = &JitFFI::SysV64::get_argtypeinfo_ret_data]"
                 );
  }
  ArgTypeInfo::ArgTypeInfo(this,(uint32_t)uVar6);
  ArgTypeInfo::RetData::RetData
            (&ard,(restype->super_ArgTypeUnitBase).type,
             (uint16_t)(restype->super_ArgTypeUnitBase).size);
  if ((restype->super_ArgTypeUnitBase).type == 2) {
    if ((restype->super_ArgTypeUnitBase).size < 0x11) {
      local_39 = get_argstructtypeinfo(restype);
      ArgTypeInfo::RetData::setstd(&ard,&local_39);
      AVar2 = ArgTypeInfo::StructTypeData::get(&ard.std,0);
      if ((AVar2 != AT_Memory) &&
         (AVar2 = ArgTypeInfo::StructTypeData::get(&ard.std,1), AVar2 != AT_Memory))
      goto LAB_0010fd67;
    }
    ard.type = '\n';
  }
LAB_0010fd67:
  this->retdata = ard;
  uVar6 = 0;
  p_Var7 = (_List_node_base *)atlist;
  local_38 = __return_storage_ptr__;
  do {
    pAVar1 = local_38;
    p_Var7 = (((_List_base<const_JitFFI::ArgTypeUnit_*,_std::allocator<const_JitFFI::ArgTypeUnit_*>_>
                *)&p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var7 == (_List_node_base *)atlist) {
      local_38->_platform = P_SysV64;
      std::__shared_ptr<void,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<JitFFI::SysV64::ArgTypeInfo,JitFFI::ArgumentInfo::ArgumentInfo<JitFFI::SysV64::ArgTypeInfo>(JitFFI::Platform,JitFFI::SysV64::ArgTypeInfo*)::_lambda(void*)_1_,void>
                ((__shared_ptr<void,(__gnu_cxx::_Lock_policy)2> *)&local_38->_data,this);
      return pAVar1;
    }
    atu = (ArgTypeUnit *)p_Var7[1]._M_next;
    switch((atu->super_ArgTypeUnitBase).type) {
    case 2:
      uVar5 = (atu->super_ArgTypeUnitBase).size;
      if (0x10 < uVar5) goto LAB_0010fdad;
      local_43 = get_argstructtypeinfo(atu);
      AVar2 = ArgTypeInfo::StructTypeData::get(&local_43,0);
      local_42 = get_pass_type(AVar2);
      AVar2 = ArgTypeInfo::StructTypeData::get(&local_43,1);
      t1 = get_pass_type(AVar2);
      ArgTypeInfo::StructBaseData::StructBaseData(&local_41,local_42,t1);
      uVar3 = (uint)(byte)local_41 << 8;
      uVar4 = 4 - (((byte)local_41 & 0xf0) == 0x30 || ((byte)local_41 & 0xf) == 3);
      goto LAB_0010fdb0;
    case 3:
      uVar5 = (atu->super_ArgTypeUnitBase).size;
      uVar4 = 1;
      break;
    case 4:
      uVar5 = (atu->super_ArgTypeUnitBase).size;
      uVar4 = 2;
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/CVM-Projects[P]JitFFI/source/jitffi-sysv64.cpp"
                    ,0x167,
                    "ArgTypeInfo::PassData JitFFI::SysV64::get_argtypeinfo_pass_data(const ArgTypeUnit &)"
                   );
    case 6:
    case 7:
    case 8:
    case 10:
      uVar5 = (atu->super_ArgTypeUnitBase).size;
LAB_0010fdad:
      uVar4 = 3;
    }
    uVar3 = 0;
LAB_0010fdb0:
    (this->typelist).data._M_t.
    super___uniq_ptr_impl<JitFFI::SysV64::ArgTypeInfo::PassData,_JitFFI::UPtrValVector<JitFFI::SysV64::ArgTypeInfo::PassData>::Deleter>
    ._M_t.
    super__Tuple_impl<0UL,_JitFFI::SysV64::ArgTypeInfo::PassData_*,_JitFFI::UPtrValVector<JitFFI::SysV64::ArgTypeInfo::PassData>::Deleter>
    .super__Head_base<0UL,_JitFFI::SysV64::ArgTypeInfo::PassData_*,_false>._M_head_impl[uVar6] =
         (PassData)(uVar5 << 0x10 | uVar3 | uVar4);
    uVar6 = (ulong)((int)uVar6 + 1);
  } while( true );
}

Assistant:

ArgumentInfo GetArgInfo(const ArgTypeUnit &restype, const ArgTypeList &atlist) {
			ArgTypeInfo *p_ati = new ArgTypeInfo(create_argtypeinfo(restype, atlist));
			return ArgumentInfo(P_SysV64, p_ati);
		}